

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O3

int serial_compare_by_fd(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)bv + 0x10) <= *(int *)((long)av + 0x10)) {
    uVar1 = (uint)(*(int *)((long)bv + 0x10) < *(int *)((long)av + 0x10));
  }
  return uVar1;
}

Assistant:

static int serial_compare_by_fd(void *av, void *bv)
{
    Serial *a = (Serial *)av;
    Serial *b = (Serial *)bv;

    if (a->fd < b->fd)
        return -1;
    else if (a->fd > b->fd)
        return +1;
    return 0;
}